

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageHandler.cxx
# Opt level: O3

int __thiscall
cmCTestCoverageHandler::HandleLCovCoverage
          (cmCTestCoverageHandler *this,cmCTestCoverageHandlerContainer *cont)

{
  pointer pcVar1;
  cmCTest *pcVar2;
  pointer pbVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  ostream *poVar8;
  long *plVar9;
  pointer pbVar10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar11;
  mapped_type *this_00;
  long lVar12;
  long *plVar13;
  size_type *psVar14;
  pointer piVar15;
  iterator __position;
  ulong uVar16;
  int retVal;
  string lcovFile;
  string nl;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lcovFiles;
  string lineNumber;
  string output;
  string command;
  string actualSourceFile;
  string daGlob;
  string errors;
  string srcname;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  string sourceFile;
  string dir;
  string fileDir;
  string st2lcovOutputRex3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lines;
  ostringstream cmCTestLog_msg;
  string lcovExtraFlags;
  string lcovCommand;
  ostringstream cmCTestLog_msg_14;
  ostringstream cmCTestLog_msg_20;
  string testingDir;
  cmWorkingDirectory workdir;
  cmCTestCoverageHandlerLocale locale_C;
  Glob gl;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  missingFiles;
  RegularExpression st2re3;
  bool local_9ed;
  int local_9ec;
  int local_9dc;
  string *local_9d8;
  char *local_9d0;
  long local_9c8;
  char local_9c0;
  undefined7 uStack_9bf;
  int local_9ac;
  string local_9a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_988;
  long *local_970 [2];
  long local_960 [2];
  string local_950;
  long *local_930;
  long local_928;
  long local_920;
  long lStack_918;
  key_type local_910;
  int local_8ec;
  string local_8e8;
  string local_8c8;
  string local_8a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_888;
  char *local_868;
  long local_860;
  char local_858;
  undefined7 uStack_857;
  undefined1 *local_848;
  undefined8 local_840;
  undefined1 local_838;
  undefined7 uStack_837;
  string local_828;
  long *local_808 [2];
  long local_7f8 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_7e8;
  undefined1 local_7c8 [32];
  byte abStack_7a8 [80];
  ios_base local_758 [408];
  string local_5c0;
  string local_5a0;
  long *local_580;
  long local_578;
  long local_570;
  long lStack_568;
  byte abStack_560 [80];
  ios_base local_510 [408];
  pointer local_378;
  TotalCoverageMap *local_370;
  pointer local_368;
  undefined1 local_360 [112];
  ios_base local_2f0 [264];
  string local_1e8;
  cmWorkingDirectory local_1c8;
  cmCTestCoverageHandlerLocale local_1a8;
  Glob local_188;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_130;
  RegularExpression local_100;
  
  pcVar2 = (this->super_cmCTestGenericHandler).CTest;
  pcVar1 = local_7c8 + 0x10;
  local_7c8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_7c8,"CoverageCommand","");
  cmCTest::GetCTestConfiguration(&local_5a0,pcVar2,(string *)local_7c8);
  if ((pointer)local_7c8._0_8_ != pcVar1) {
    operator_delete((void *)local_7c8._0_8_,local_7c8._16_8_ + 1);
  }
  pcVar2 = (this->super_cmCTestGenericHandler).CTest;
  local_7c8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_7c8,"CoverageExtraFlags","");
  cmCTest::GetCTestConfiguration(&local_5c0,pcVar2,(string *)local_7c8);
  if ((pointer)local_7c8._0_8_ != pcVar1) {
    operator_delete((void *)local_7c8._0_8_,local_7c8._16_8_ + 1);
  }
  iVar5 = std::__cxx11::string::compare((char *)&local_5a0);
  if (iVar5 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_7c8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_7c8," Not a valid Intel Coverage command.",0x24);
    std::ios::widen((char)(ostream *)local_7c8 + (char)*(undefined8 *)(local_7c8._0_8_ + -0x18));
    std::ostream::put((char)local_7c8);
    std::ostream::flush();
    pcVar2 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar2,4,
                 "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                 ,0x51f,(char *)local_580,(this->super_cmCTestGenericHandler).Quiet);
    if (local_580 != &local_570) {
      operator_delete(local_580,local_570 + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_7c8);
    std::ios_base::~ios_base(local_758);
    local_9ec = 0;
    goto LAB_002b146d;
  }
  local_808[0] = local_7f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_808,"[0-9]+%","");
  local_100.program = (char *)0x0;
  if (local_808[0] != (long *)0x0) {
    cmsys::RegularExpression::compile(&local_100,(char *)local_808[0]);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_7c8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_7c8," This is coverage command: ",0x1b);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_7c8,local_5a0._M_dataplus._M_p,local_5a0._M_string_length);
  std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  pcVar2 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar2,4,
               "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
               ,0x528,(char *)local_580,(this->super_cmCTestGenericHandler).Quiet);
  if (local_580 != &local_570) {
    operator_delete(local_580,local_570 + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_7c8);
  std::ios_base::~ios_base(local_758);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_7c8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_7c8," These are coverage command flags: ",0x23);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_7c8,local_5c0._M_dataplus._M_p,local_5c0._M_string_length);
  std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  pcVar2 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar2,4,
               "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
               ,0x52d,(char *)local_580,(this->super_cmCTestGenericHandler).Quiet);
  if (local_580 != &local_570) {
    operator_delete(local_580,local_570 + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_7c8);
  std::ios_base::~ios_base(local_758);
  local_888.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
  local_888.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
  local_888.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar4 = FindLCovFiles(this,&local_888);
  if (bVar4) {
    if (local_888.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_888.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_7c8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_7c8," Cannot find any LCov coverage files.",0x25);
      std::ios::widen((char)(ostream *)local_7c8 + (char)*(undefined8 *)(local_7c8._0_8_ + -0x18));
      std::ostream::put((char)local_7c8);
      std::ostream::flush();
      pcVar2 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar2,4,
                   "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                   ,0x53a,(char *)local_580,(this->super_cmCTestGenericHandler).Quiet);
      goto LAB_002b137b;
    }
    cmCTest::GetBinaryDir_abi_cxx11_(&local_1e8,(this->super_cmCTestGenericHandler).CTest);
    local_130._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_130._M_impl.super__Rb_tree_header._M_header;
    local_130._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_130._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_130._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_910._M_dataplus._M_p = (pointer)&local_910.field_2;
    local_910._M_string_length = 0;
    local_910.field_2._M_local_buf[0] = '\0';
    local_130._M_impl.super__Rb_tree_header._M_header._M_right =
         local_130._M_impl.super__Rb_tree_header._M_header._M_left;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_7c8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_7c8,"   Processing coverage (each . represents one file):",0x34);
    std::ios::widen((char)(ostream *)local_7c8 + (char)*(undefined8 *)(local_7c8._0_8_ + -0x18));
    std::ostream::put((char)local_7c8);
    std::ostream::flush();
    pcVar2 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar2,2,
                 "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                 ,0x546,(char *)local_580,(this->super_cmCTestGenericHandler).Quiet);
    if (local_580 != &local_570) {
      operator_delete(local_580,local_570 + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_7c8);
    std::ios_base::~ios_base(local_758);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_7c8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_7c8,"    ",4);
    pcVar2 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar2,2,
                 "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                 ,0x547,(char *)local_580,(this->super_cmCTestGenericHandler).Quiet);
    if (local_580 != &local_570) {
      operator_delete(local_580,local_570 + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_7c8);
    std::ios_base::~ios_base(local_758);
    cmCTestCoverageHandlerLocale::cmCTestCoverageHandlerLocale(&local_1a8);
    local_9d8 = local_888.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    if (local_888.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_888.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
LAB_002b13bd:
      local_9ec = 0;
    }
    else {
      local_370 = &cont->TotalCoverage;
      local_9ec = 0;
      do {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_7c8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_7c8,".",1);
        std::ostream::flush();
        pcVar2 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar2,2,
                     "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                     ,0x552,(char *)local_580,(this->super_cmCTestGenericHandler).Quiet);
        if (local_580 != &local_570) {
          operator_delete(local_580,local_570 + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_7c8);
        std::ios_base::~ios_base(local_758);
        cmsys::SystemTools::GetFilenamePath(&local_828,local_9d8);
        cmWorkingDirectory::cmWorkingDirectory(&local_1c8,&local_828);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_360,"\"",&local_5a0);
        plVar9 = (long *)std::__cxx11::string::append((char *)local_360);
        plVar13 = plVar9 + 2;
        if ((long *)*plVar9 == plVar13) {
          local_570 = *plVar13;
          lStack_568 = plVar9[3];
          local_580 = &local_570;
        }
        else {
          local_570 = *plVar13;
          local_580 = (long *)*plVar9;
        }
        local_578 = plVar9[1];
        *plVar9 = (long)plVar13;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        plVar9 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_580,(ulong)local_5c0._M_dataplus._M_p);
        local_7c8._0_8_ = local_7c8 + 0x10;
        psVar14 = (size_type *)(plVar9 + 2);
        if ((size_type *)*plVar9 == psVar14) {
          local_7c8._16_8_ = *psVar14;
          local_7c8._24_8_ = plVar9[3];
        }
        else {
          local_7c8._16_8_ = *psVar14;
          local_7c8._0_8_ = (size_type *)*plVar9;
        }
        local_7c8._8_8_ = plVar9[1];
        *plVar9 = (long)psVar14;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        plVar9 = (long *)std::__cxx11::string::append(local_7c8);
        local_930 = &local_920;
        plVar13 = plVar9 + 2;
        if ((long *)*plVar9 == plVar13) {
          local_920 = *plVar13;
          lStack_918 = plVar9[3];
        }
        else {
          local_920 = *plVar13;
          local_930 = (long *)*plVar9;
        }
        local_928 = plVar9[1];
        *plVar9 = (long)plVar13;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        if ((undefined1 *)local_7c8._0_8_ != local_7c8 + 0x10) {
          operator_delete((void *)local_7c8._0_8_,local_7c8._16_8_ + 1);
        }
        if (local_580 != &local_570) {
          operator_delete(local_580,local_570 + 1);
        }
        if ((undefined1 *)local_360._0_8_ != local_360 + 0x10) {
          operator_delete((void *)local_360._0_8_,local_360._16_8_ + 1);
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_7c8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_7c8,"Current coverage dir: ",0x16);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_7c8,local_828._M_dataplus._M_p,
                            local_828._M_string_length);
        std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
        std::ostream::put((char)poVar8);
        std::ostream::flush();
        pcVar2 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar2,4,
                     "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                     ,0x559,(char *)local_580,(this->super_cmCTestGenericHandler).Quiet);
        if (local_580 != &local_570) {
          operator_delete(local_580,local_570 + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_7c8);
        std::ios_base::~ios_base(local_758);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_7c8);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_7c8,(char *)local_930,local_928);
        std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
        std::ostream::put((char)poVar8);
        std::ostream::flush();
        pcVar2 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar2,4,
                     "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                     ,0x55b,(char *)local_580,(this->super_cmCTestGenericHandler).Quiet);
        if (local_580 != &local_570) {
          operator_delete(local_580,local_570 + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_7c8);
        std::ios_base::~ios_base(local_758);
        local_950._M_dataplus._M_p = (pointer)&local_950.field_2;
        local_950._M_string_length = 0;
        local_950.field_2._M_local_buf[0] = '\0';
        local_8c8._M_dataplus._M_p = (pointer)&local_8c8.field_2;
        local_8c8._M_string_length = 0;
        local_8c8.field_2._M_local_buf[0] = '\0';
        local_9dc = 0;
        poVar8 = cont->OFS;
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"* Run coverage for: ",0x14);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,local_828._M_dataplus._M_p,local_828._M_string_length);
        std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
        std::ostream::put((char)poVar8);
        std::ostream::flush();
        poVar8 = cont->OFS;
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"  Command: ",0xb);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,(char *)local_930,local_928);
        std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
        std::ostream::put((char)poVar8);
        std::ostream::flush();
        bVar4 = cmCTest::RunCommand((this->super_cmCTestGenericHandler).CTest,(char *)local_930,
                                    &local_950,&local_8c8,&local_9dc,local_828._M_dataplus._M_p,0.0,
                                    Auto);
        poVar8 = cont->OFS;
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"  Output: ",10);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,local_950._M_dataplus._M_p,local_950._M_string_length);
        std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
        std::ostream::put((char)poVar8);
        std::ostream::flush();
        poVar8 = cont->OFS;
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"  Errors: ",10);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,local_8c8._M_dataplus._M_p,local_8c8._M_string_length);
        std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
        std::ostream::put((char)poVar8);
        std::ostream::flush();
        if (bVar4) {
          if (local_9dc != 0) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_7c8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_7c8,"Coverage command returned: ",0x1b);
            poVar8 = (ostream *)std::ostream::operator<<(local_7c8,local_9dc);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8," while processing: ",0x13);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar8,(local_9d8->_M_dataplus)._M_p,local_9d8->_M_string_length);
            std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
            std::ostream::put((char)poVar8);
            std::ostream::flush();
            pcVar2 = (this->super_cmCTestGenericHandler).CTest;
            std::__cxx11::stringbuf::str();
            cmCTest::Log(pcVar2,6,
                         "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                         ,0x572,(char *)local_580,false);
            if (local_580 != &local_570) {
              operator_delete(local_580,local_570 + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_7c8);
            std::ios_base::~ios_base(local_758);
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_7c8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_7c8,"Command produced error: ",0x18);
            plVar9 = (long *)std::ostream::operator<<(local_7c8,cont->Error);
            std::ios::widen((char)*(undefined8 *)(*plVar9 + -0x18) + (char)plVar9);
            std::ostream::put((char)plVar9);
            std::ostream::flush();
            pcVar2 = (this->super_cmCTestGenericHandler).CTest;
            std::__cxx11::stringbuf::str();
            cmCTest::Log(pcVar2,6,
                         "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                         ,0x574,(char *)local_580,false);
            if (local_580 != &local_570) {
              operator_delete(local_580,local_570 + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_7c8);
            std::ios_base::~ios_base(local_758);
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_7c8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_7c8,
                     "--------------------------------------------------------------",0x3e);
          std::ios::widen((char)*(undefined8 *)(local_7c8._0_8_ + -0x18) + (char)local_7c8);
          std::ostream::put((char)local_7c8);
          poVar8 = (ostream *)std::ostream::flush();
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,local_950._M_dataplus._M_p,local_950._M_string_length);
          std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
          std::ostream::put((char)poVar8);
          poVar8 = (ostream *)std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8,"--------------------------------------------------------------",0x3e);
          std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
          std::ostream::put((char)poVar8);
          std::ostream::flush();
          pcVar2 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar2,4,
                       "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                       ,0x57d,(char *)local_580,(this->super_cmCTestGenericHandler).Quiet);
          if (local_580 != &local_570) {
            operator_delete(local_580,local_570 + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_7c8);
          std::ios_base::~ios_base(local_758);
          local_7e8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_7e8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_7e8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          cmSystemTools::Split(local_950._M_dataplus._M_p,&local_7e8);
          pbVar10 = local_7e8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          while (pbVar10 !=
                 local_7e8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish) {
            local_868 = &local_858;
            local_860 = 0;
            local_858 = '\0';
            local_9d0 = &local_9c0;
            local_9c8 = 0;
            local_9c0 = '\0';
            local_378 = pbVar10;
            cmsys::Glob::Glob(&local_188);
            local_188.Recurse = true;
            local_188.RecurseThroughSymlinks = false;
            local_848 = &local_838;
            local_840 = 0;
            local_838 = 0;
            local_988.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_988.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_988.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            cmCTest::GetBinaryDir_abi_cxx11_
                      ((string *)local_7c8,(this->super_cmCTestGenericHandler).CTest);
            std::__cxx11::string::operator=((string *)&local_848,(string *)local_7c8);
            if ((undefined1 *)local_7c8._0_8_ != local_7c8 + 0x10) {
              operator_delete((void *)local_7c8._0_8_,local_7c8._16_8_ + 1);
            }
            local_8e8._M_dataplus._M_p = (pointer)&local_8e8.field_2;
            local_8e8._M_string_length = 0;
            local_8e8.field_2._M_local_buf[0] = '\0';
            std::__cxx11::string::_M_assign((string *)&local_8e8);
            std::__cxx11::string::append((char *)&local_8e8);
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_7c8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_7c8,"   looking for LCOV files in: ",0x1e);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_7c8,local_8e8._M_dataplus._M_p,
                                local_8e8._M_string_length);
            std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
            std::ostream::put((char)poVar8);
            std::ostream::flush();
            pcVar2 = (this->super_cmCTestGenericHandler).CTest;
            std::__cxx11::stringbuf::str();
            cmCTest::Log(pcVar2,4,
                         "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                         ,0x599,(char *)local_580,(this->super_cmCTestGenericHandler).Quiet);
            if (local_580 != &local_570) {
              operator_delete(local_580,local_570 + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_7c8);
            std::ios_base::~ios_base(local_758);
            cmsys::Glob::FindFiles(&local_188,&local_8e8,(GlobMessages *)0x0);
            pbVar3 = local_988.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            pvVar11 = cmsys::Glob::GetFiles_abi_cxx11_(&local_188);
            pbVar10 = (pvVar11->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            pvVar11 = cmsys::Glob::GetFiles_abi_cxx11_(&local_188);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &local_988,pbVar3,pbVar10,
                       (pvVar11->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish);
            local_9ac = 0;
            pbVar10 = local_988.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if (local_988.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start ==
                local_988.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              local_9ed = true;
            }
            else {
              do {
                local_368 = pbVar10;
                std::__cxx11::string::_M_assign((string *)&local_9d0);
                std::ifstream::ifstream((istream *)local_7c8,local_9d0,_S_in);
                if ((abStack_7a8[*(long *)(local_7c8._0_8_ + -0x18)] & 5) != 0) {
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_580);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_580,"Cannot open file: ",0x12);
                  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                     ((ostream *)&local_580,local_9d0,local_9c8);
                  std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
                  std::ostream::put((char)poVar8);
                  std::ostream::flush();
                  pcVar2 = (this->super_cmCTestGenericHandler).CTest;
                  std::__cxx11::stringbuf::str();
                  cmCTest::Log(pcVar2,6,
                               "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                               ,0x5a5,(char *)local_360._0_8_,false);
                  if ((undefined1 *)local_360._0_8_ != local_360 + 0x10) {
                    operator_delete((void *)local_360._0_8_,local_360._16_8_ + 1);
                  }
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_580);
                  std::ios_base::~ios_base(local_510);
                }
                local_8a8._M_dataplus._M_p = (pointer)&local_8a8.field_2;
                local_8a8._M_string_length = 0;
                local_8a8.field_2._M_local_buf[0] = '\0';
                local_9ed = cmsys::SystemTools::GetLineFromStream
                                      ((istream *)local_7c8,&local_8a8,(bool *)0x0,-1);
                if (local_9ed) {
                  std::__cxx11::string::substr((ulong)&local_580,(ulong)&local_8a8);
                  std::__cxx11::string::operator=((string *)&local_8a8,(string *)&local_580);
                  if (local_580 != &local_570) {
                    operator_delete(local_580,local_570 + 1);
                  }
                  std::__cxx11::string::_M_assign((string *)&local_868);
                  std::__cxx11::string::_M_assign((string *)&local_910);
                  for (pbVar10 = local_988.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start;
                      pbVar10 !=
                      local_988.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish; pbVar10 = pbVar10 + 1) {
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_580);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_580,"Found LCOV File: ",0x11);
                    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                       ((ostream *)&local_580,(pbVar10->_M_dataplus)._M_p,
                                        pbVar10->_M_string_length);
                    std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
                    std::ostream::put((char)poVar8);
                    std::ostream::flush();
                    pcVar2 = (this->super_cmCTestGenericHandler).CTest;
                    std::__cxx11::stringbuf::str();
                    cmCTest::Log(pcVar2,4,
                                 "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                                 ,0x5bb,(char *)local_360._0_8_,
                                 (this->super_cmCTestGenericHandler).Quiet);
                    if ((undefined1 *)local_360._0_8_ != local_360 + 0x10) {
                      operator_delete((void *)local_360._0_8_,local_360._16_8_ + 1);
                    }
                    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_580);
                    std::ios_base::~ios_base(local_510);
                  }
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_580);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_580,"SourceFile: ",0xc);
                  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                     ((ostream *)&local_580,local_868,local_860);
                  std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
                  std::ostream::put((char)poVar8);
                  std::ostream::flush();
                  pcVar2 = (this->super_cmCTestGenericHandler).CTest;
                  std::__cxx11::stringbuf::str();
                  cmCTest::Log(pcVar2,4,
                               "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                               ,0x5bf,(char *)local_360._0_8_,
                               (this->super_cmCTestGenericHandler).Quiet);
                  if ((undefined1 *)local_360._0_8_ != local_360 + 0x10) {
                    operator_delete((void *)local_360._0_8_,local_360._16_8_ + 1);
                  }
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_580);
                  std::ios_base::~ios_base(local_510);
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_580);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_580,"lCovFile: ",10);
                  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                     ((ostream *)&local_580,local_9d0,local_9c8);
                  std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
                  std::ostream::put((char)poVar8);
                  std::ostream::flush();
                  pcVar2 = (this->super_cmCTestGenericHandler).CTest;
                  std::__cxx11::stringbuf::str();
                  cmCTest::Log(pcVar2,4,
                               "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                               ,0x5c1,(char *)local_360._0_8_,
                               (this->super_cmCTestGenericHandler).Quiet);
                  if ((undefined1 *)local_360._0_8_ != local_360 + 0x10) {
                    operator_delete((void *)local_360._0_8_,local_360._16_8_ + 1);
                  }
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_580);
                  std::ios_base::~ios_base(local_510);
                  if ((local_9c8 != 0) && ((char *)local_910._M_string_length != (char *)0x0)) {
                    this_00 = std::
                              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                              ::operator[](local_370,&local_910);
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_580);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_580,"   in lcovFile: ",0x10);
                    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                       ((ostream *)&local_580,local_9d0,local_9c8);
                    std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
                    std::ostream::put((char)poVar8);
                    std::ostream::flush();
                    pcVar2 = (this->super_cmCTestGenericHandler).CTest;
                    std::__cxx11::stringbuf::str();
                    cmCTest::Log(pcVar2,4,
                                 "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                                 ,0x5ca,(char *)local_360._0_8_,
                                 (this->super_cmCTestGenericHandler).Quiet);
                    if ((undefined1 *)local_360._0_8_ != local_360 + 0x10) {
                      operator_delete((void *)local_360._0_8_,local_360._16_8_ + 1);
                    }
                    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_580);
                    std::ios_base::~ios_base(local_510);
                    std::ifstream::ifstream((ostringstream *)&local_580,local_9d0,_S_in);
                    if ((abStack_560[local_580[-3]] & 5) == 0) {
                      local_9a8._M_dataplus._M_p = (pointer)&local_9a8.field_2;
                      local_9a8._M_string_length = 0;
                      local_9a8.field_2._M_local_buf[0] = '\0';
                      cmsys::SystemTools::GetLineFromStream
                                ((istream *)&local_580,&local_9a8,(bool *)0x0,-1);
                      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_360);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_360,"File is ready, start reading.",0x1d);
                      std::ios::widen((char)*(undefined8 *)(local_360._0_8_ + -0x18) +
                                      (char)local_360);
                      std::ostream::put((char)local_360);
                      std::ostream::flush();
                      pcVar2 = (this->super_cmCTestGenericHandler).CTest;
                      std::__cxx11::stringbuf::str();
                      cmCTest::Log(pcVar2,4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                                   ,0x5d8,(char *)local_970[0],
                                   (this->super_cmCTestGenericHandler).Quiet);
                      if (local_970[0] != local_960) {
                        operator_delete(local_970[0],local_960[0] + 1);
                      }
                      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_360);
                      std::ios_base::~ios_base(local_2f0);
                      while (bVar4 = cmsys::SystemTools::GetLineFromStream
                                               ((istream *)&local_580,&local_9a8,(bool *)0x0,-1),
                            bVar4) {
                        if (0xb < local_9a8._M_string_length) {
                          std::__cxx11::string::substr((ulong)local_360,(ulong)&local_9a8);
                          iVar5 = atoi((char *)local_360._0_8_);
                          std::__cxx11::string::substr((ulong)local_970,(ulong)&local_9a8);
                          plVar9 = local_970[0];
                          iVar6 = atoi((char *)local_970[0]);
                          if (0 < iVar6) {
                            uVar16 = (ulong)(iVar6 - 1);
LAB_002b0bb2:
                            piVar15 = (this_00->super__Vector_base<int,_std::allocator<int>_>).
                                      _M_impl.super__Vector_impl_data._M_start;
                            __position._M_current =
                                 (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                 super__Vector_impl_data._M_finish;
                            do {
                              if (uVar16 < (ulong)((long)__position._M_current - (long)piVar15 >> 2)
                                 ) {
                                iVar6 = piVar15[uVar16];
                                if (iVar6 < 0) {
                                  if (iVar5 < 1) {
                                    lVar12 = std::__cxx11::string::find((char)local_360,0x23);
                                    piVar15 = (this_00->
                                              super__Vector_base<int,_std::allocator<int>_>)._M_impl
                                              .super__Vector_impl_data._M_start;
                                    if (lVar12 == -1) {
                                      iVar6 = piVar15[uVar16];
                                      goto LAB_002b0c31;
                                    }
                                  }
                                  piVar15[uVar16] = 0;
                                  iVar6 = 0;
                                }
LAB_002b0c31:
                                piVar15[uVar16] = iVar6 + iVar5;
                                plVar9 = local_970[0];
                                break;
                              }
                              local_8ec = -1;
                              if (__position._M_current ==
                                  (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                  super__Vector_impl_data._M_end_of_storage) goto LAB_002b0bea;
                              *__position._M_current = -1;
                              __position._M_current = __position._M_current + 1;
                              (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_finish = __position._M_current;
                            } while( true );
                          }
                          if (plVar9 != local_960) {
                            operator_delete(plVar9,local_960[0] + 1);
                          }
                          if ((undefined1 *)local_360._0_8_ != local_360 + 0x10) {
                            operator_delete((void *)local_360._0_8_,local_360._16_8_ + 1);
                          }
                        }
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_9a8._M_dataplus._M_p != &local_9a8.field_2) {
                        operator_delete(local_9a8._M_dataplus._M_p,
                                        CONCAT71(local_9a8.field_2._M_allocated_capacity._1_7_,
                                                 local_9a8.field_2._M_local_buf[0]) + 1);
                      }
                    }
                    else {
                      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_360);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_360,"Cannot open file: ",0x12);
                      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                         ((ostream *)local_360,local_9d0,local_9c8);
                      std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
                      std::ostream::put((char)poVar8);
                      std::ostream::flush();
                      pcVar2 = (this->super_cmCTestGenericHandler).CTest;
                      std::__cxx11::stringbuf::str();
                      cmCTest::Log(pcVar2,6,
                                   "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                                   ,0x5cf,local_9a8._M_dataplus._M_p,false);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_9a8._M_dataplus._M_p != &local_9a8.field_2) {
                        operator_delete(local_9a8._M_dataplus._M_p,
                                        CONCAT71(local_9a8.field_2._M_allocated_capacity._1_7_,
                                                 local_9a8.field_2._M_local_buf[0]) + 1);
                      }
                      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_360);
                      std::ios_base::~ios_base(local_2f0);
                    }
                    std::__cxx11::string::_M_replace
                              ((ulong)&local_910,0,(char *)local_910._M_string_length,0x66eafa);
                    std::ifstream::~ifstream((ostringstream *)&local_580);
                  }
                }
                else {
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_580);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_580,"Error while parsing lcov file \'",0x1f);
                  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                     ((ostream *)&local_580,local_9d0,local_9c8);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\':",2);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar8," No source file name found!",0x1b);
                  std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
                  std::ostream::put((char)poVar8);
                  std::ostream::flush();
                  pcVar2 = (this->super_cmCTestGenericHandler).CTest;
                  std::__cxx11::stringbuf::str();
                  cmCTest::Log(pcVar2,6,
                               "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                               ,0x5ae,(char *)local_360._0_8_,false);
                  if ((undefined1 *)local_360._0_8_ != local_360 + 0x10) {
                    operator_delete((void *)local_360._0_8_,local_360._16_8_ + 1);
                  }
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_580);
                  std::ios_base::~ios_base(local_510);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_8a8._M_dataplus._M_p != &local_8a8.field_2) {
                  operator_delete(local_8a8._M_dataplus._M_p,
                                  CONCAT71(local_8a8.field_2._M_allocated_capacity._1_7_,
                                           local_8a8.field_2._M_local_buf[0]) + 1);
                }
                std::ifstream::~ifstream(local_7c8);
                if (!local_9ed) {
                  local_9ac = 1;
                  break;
                }
                pbVar10 = local_368 + 1;
              } while (pbVar10 !=
                       local_988.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_8e8._M_dataplus._M_p != &local_8e8.field_2) {
              operator_delete(local_8e8._M_dataplus._M_p,
                              CONCAT71(local_8e8.field_2._M_allocated_capacity._1_7_,
                                       local_8e8.field_2._M_local_buf[0]) + 1);
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_988);
            if (local_848 != &local_838) {
              operator_delete(local_848,CONCAT71(uStack_837,local_838) + 1);
            }
            cmsys::Glob::~Glob(&local_188);
            if (local_9d0 != &local_9c0) {
              operator_delete(local_9d0,CONCAT71(uStack_9bf,local_9c0) + 1);
            }
            if (local_868 != &local_858) {
              operator_delete(local_868,CONCAT71(uStack_857,local_858) + 1);
            }
            iVar5 = local_9ac;
            if (local_9ed == false) goto LAB_002b119e;
            pbVar10 = local_378 + 1;
          }
          iVar5 = local_9ec * -0x3d70a3d7;
          local_9ec = local_9ec + 1;
          uVar7 = iVar5 + 0xc7ae1479;
          iVar5 = 0;
          if ((uVar7 >> 1 | (uint)((uVar7 & 1) != 0) << 0x1f) < 0x51eb851) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_7c8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_7c8," processed: ",0xc);
            poVar8 = (ostream *)std::ostream::operator<<(local_7c8,local_9ec);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8," out of ",8);
            poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
            std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
            std::ostream::put((char)poVar8);
            std::ostream::flush();
            pcVar2 = (this->super_cmCTestGenericHandler).CTest;
            std::__cxx11::stringbuf::str();
            cmCTest::Log(pcVar2,2,
                         "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                         ,0x60d,(char *)local_580,(this->super_cmCTestGenericHandler).Quiet);
            if (local_580 != &local_570) {
              operator_delete(local_580,local_570 + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_7c8);
            std::ios_base::~ios_base(local_758);
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_7c8);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_7c8,"    ",4);
            pcVar2 = (this->super_cmCTestGenericHandler).CTest;
            std::__cxx11::stringbuf::str();
            cmCTest::Log(pcVar2,2,
                         "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                         ,0x60e,(char *)local_580,(this->super_cmCTestGenericHandler).Quiet);
            if (local_580 != &local_570) {
              operator_delete(local_580,local_570 + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_7c8);
            std::ios_base::~ios_base(local_758);
          }
LAB_002b119e:
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_7e8);
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_7c8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_7c8,"Problem running coverage on file: ",0x22);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_7c8,(local_9d8->_M_dataplus)._M_p,
                              local_9d8->_M_string_length);
          std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
          std::ostream::put((char)poVar8);
          std::ostream::flush();
          pcVar2 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar2,6,
                       "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                       ,0x56a,(char *)local_580,false);
          if (local_580 != &local_570) {
            operator_delete(local_580,local_570 + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_7c8);
          std::ios_base::~ios_base(local_758);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_7c8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_7c8,"Command produced error: ",0x18);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_7c8,local_8c8._M_dataplus._M_p,
                              local_8c8._M_string_length);
          std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
          std::ostream::put((char)poVar8);
          std::ostream::flush();
          pcVar2 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar2,6,
                       "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                       ,0x56c,(char *)local_580,false);
          if (local_580 != &local_570) {
            operator_delete(local_580,local_570 + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_7c8);
          std::ios_base::~ios_base(local_758);
          cont->Error = cont->Error + 1;
          iVar5 = 0x12;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_8c8._M_dataplus._M_p != &local_8c8.field_2) {
          operator_delete(local_8c8._M_dataplus._M_p,
                          CONCAT71(local_8c8.field_2._M_allocated_capacity._1_7_,
                                   local_8c8.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_950._M_dataplus._M_p != &local_950.field_2) {
          operator_delete(local_950._M_dataplus._M_p,
                          CONCAT71(local_950.field_2._M_allocated_capacity._1_7_,
                                   local_950.field_2._M_local_buf[0]) + 1);
        }
        if (local_930 != &local_920) {
          operator_delete(local_930,local_920 + 1);
        }
        cmWorkingDirectory::~cmWorkingDirectory(&local_1c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_828._M_dataplus._M_p != &local_828.field_2) {
          operator_delete(local_828._M_dataplus._M_p,local_828.field_2._M_allocated_capacity + 1);
        }
        if ((iVar5 != 0x12) && (iVar5 != 0)) goto LAB_002b13bd;
        local_9d8 = local_9d8 + 1;
      } while (local_9d8 !=
               local_888.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    cmCTestCoverageHandlerLocale::~cmCTestCoverageHandlerLocale(&local_1a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_910._M_dataplus._M_p != &local_910.field_2) {
      operator_delete(local_910._M_dataplus._M_p,
                      CONCAT71(local_910.field_2._M_allocated_capacity._1_7_,
                               local_910.field_2._M_local_buf[0]) + 1);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_130);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_7c8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_7c8,"Error while finding LCov files.\n",0x20);
    pcVar2 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar2,6,
                 "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                 ,0x532,(char *)local_580,false);
LAB_002b137b:
    if (local_580 != &local_570) {
      operator_delete(local_580,local_570 + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_7c8);
    std::ios_base::~ios_base(local_758);
    local_9ec = 0;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_888);
  if (local_100.program != (char *)0x0) {
    operator_delete__(local_100.program);
  }
  if (local_808[0] != local_7f8) {
    operator_delete(local_808[0],local_7f8[0] + 1);
  }
LAB_002b146d:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5c0._M_dataplus._M_p != &local_5c0.field_2) {
    operator_delete(local_5c0._M_dataplus._M_p,local_5c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5a0._M_dataplus._M_p != &local_5a0.field_2) {
    operator_delete(local_5a0._M_dataplus._M_p,local_5a0.field_2._M_allocated_capacity + 1);
  }
  return local_9ec;
LAB_002b0bea:
  std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(this_00,__position,&local_8ec);
  goto LAB_002b0bb2;
}

Assistant:

int cmCTestCoverageHandler::HandleLCovCoverage(
  cmCTestCoverageHandlerContainer* cont)
{
  std::string lcovCommand =
    this->CTest->GetCTestConfiguration("CoverageCommand");
  std::string lcovExtraFlags =
    this->CTest->GetCTestConfiguration("CoverageExtraFlags");
  if (lcovCommand != "codecov") {
    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                       " Not a valid Intel Coverage command." << std::endl,
                       this->Quiet);
    return 0;
  }
  // There is only percentage completed output from LCOV
  std::string st2lcovOutputRex3 = "[0-9]+%";
  cmsys::RegularExpression st2re3(st2lcovOutputRex3.c_str());

  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                     " This is coverage command: " << lcovCommand << std::endl,
                     this->Quiet);

  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                     " These are coverage command flags: " << lcovExtraFlags
                                                           << std::endl,
                     this->Quiet);

  std::vector<std::string> files;
  if (!this->FindLCovFiles(files)) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Error while finding LCov files.\n");
    return 0;
  }
  std::vector<std::string>::iterator it;

  if (files.empty()) {
    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                       " Cannot find any LCov coverage files." << std::endl,
                       this->Quiet);
    // No coverage files is a valid thing, so the exit code is 0
    return 0;
  }
  std::string testingDir = this->CTest->GetBinaryDir();

  std::set<std::string> missingFiles;

  std::string actualSourceFile;
  cmCTestOptionalLog(
    this->CTest, HANDLER_OUTPUT,
    "   Processing coverage (each . represents one file):" << std::endl,
    this->Quiet);
  cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT, "    ", this->Quiet);
  int file_count = 0;

  // make sure output from lcov is in English!
  cmCTestCoverageHandlerLocale locale_C;
  static_cast<void>(locale_C);

  // In intel compiler we have to call codecov only once in each executable
  // directory. It collects all *.dyn files to generate .dpi file.
  for (it = files.begin(); it != files.end(); ++it) {
    cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT, "." << std::flush,
                       this->Quiet);
    std::string fileDir = cmSystemTools::GetFilenamePath(*it);
    cmWorkingDirectory workdir(fileDir);
    std::string command = "\"" + lcovCommand + "\" " + lcovExtraFlags + " ";

    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                       "Current coverage dir: " << fileDir << std::endl,
                       this->Quiet);
    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                       command << std::endl, this->Quiet);

    std::string output;
    std::string errors;
    int retVal = 0;
    *cont->OFS << "* Run coverage for: " << fileDir << std::endl;
    *cont->OFS << "  Command: " << command << std::endl;
    int res =
      this->CTest->RunCommand(command.c_str(), &output, &errors, &retVal,
                              fileDir.c_str(), 0 /*this->TimeOut*/);

    *cont->OFS << "  Output: " << output << std::endl;
    *cont->OFS << "  Errors: " << errors << std::endl;
    if (!res) {
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "Problem running coverage on file: " << *it << std::endl);
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "Command produced error: " << errors << std::endl);
      cont->Error++;
      continue;
    }
    if (retVal != 0) {
      cmCTestLog(this->CTest, ERROR_MESSAGE, "Coverage command returned: "
                   << retVal << " while processing: " << *it << std::endl);
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "Command produced error: " << cont->Error << std::endl);
    }
    cmCTestOptionalLog(
      this->CTest, HANDLER_VERBOSE_OUTPUT,
      "--------------------------------------------------------------"
        << std::endl
        << output << std::endl
        << "--------------------------------------------------------------"
        << std::endl,
      this->Quiet);

    std::vector<std::string> lines;
    std::vector<std::string>::iterator line;

    cmSystemTools::Split(output.c_str(), lines);

    for (line = lines.begin(); line != lines.end(); ++line) {
      std::string sourceFile;
      std::string lcovFile;

      if (line->empty()) {
        // Ignore empty line
      }
      // Look for LCOV files in binary directory
      // Intel Compiler creates a CodeCoverage dir for each subfolder and
      // each subfolder has LCOV files
      cmsys::Glob gl;
      gl.RecurseOn();
      gl.RecurseThroughSymlinksOff();
      std::string dir;
      std::vector<std::string> lcovFiles;
      dir = this->CTest->GetBinaryDir();
      std::string daGlob;
      daGlob = dir;
      daGlob += "/*.LCOV";
      cmCTestOptionalLog(
        this->CTest, HANDLER_VERBOSE_OUTPUT,
        "   looking for LCOV files in: " << daGlob << std::endl, this->Quiet);
      gl.FindFiles(daGlob);
      // Keep a list of all LCOV files
      lcovFiles.insert(lcovFiles.end(), gl.GetFiles().begin(),
                       gl.GetFiles().end());

      for (std::vector<std::string>::iterator a = lcovFiles.begin();
           a != lcovFiles.end(); ++a) {
        lcovFile = *a;
        cmsys::ifstream srcead(lcovFile.c_str());
        if (!srcead) {
          cmCTestLog(this->CTest, ERROR_MESSAGE,
                     "Cannot open file: " << lcovFile << std::endl);
        }
        std::string srcname;

        int success = cmSystemTools::GetLineFromStream(srcead, srcname);
        if (!success) {
          cmCTestLog(this->CTest, ERROR_MESSAGE,
                     "Error while parsing lcov file '"
                       << lcovFile << "':"
                       << " No source file name found!" << std::endl);
          return 0;
        }
        srcname = srcname.substr(18);
        // We can directly read found LCOV files to determine the source
        // files
        sourceFile = srcname;
        actualSourceFile = srcname;

        for (std::vector<std::string>::iterator t = lcovFiles.begin();
             t != lcovFiles.end(); ++t) {
          cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                             "Found LCOV File: " << *t << std::endl,
                             this->Quiet);
        }
        cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                           "SourceFile: " << sourceFile << std::endl,
                           this->Quiet);
        cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                           "lCovFile: " << lcovFile << std::endl, this->Quiet);

        // If we have some LCOV files to process
        if (!lcovFile.empty() && !actualSourceFile.empty()) {
          cmCTestCoverageHandlerContainer::SingleFileCoverageVector& vec =
            cont->TotalCoverage[actualSourceFile];

          cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                             "   in lcovFile: " << lcovFile << std::endl,
                             this->Quiet);

          cmsys::ifstream ifile(lcovFile.c_str());
          if (!ifile) {
            cmCTestLog(this->CTest, ERROR_MESSAGE,
                       "Cannot open file: " << lcovFile << std::endl);
          } else {
            long cnt = -1;
            std::string nl;

            // Skip the first line
            cmSystemTools::GetLineFromStream(ifile, nl);
            cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                               "File is ready, start reading." << std::endl,
                               this->Quiet);
            while (cmSystemTools::GetLineFromStream(ifile, nl)) {
              cnt++;

              // Skip empty lines
              if (nl.empty()) {
                continue;
              }

              // Skip unused lines
              if (nl.size() < 12) {
                continue;
              }

              // Read the coverage count from the beginning of the lcov
              // output line
              std::string prefix = nl.substr(0, 17);
              int cov = atoi(prefix.c_str());

              // Read the line number starting at the 17th character of the
              // lcov output line
              std::string lineNumber = nl.substr(17, 7);

              int lineIdx = atoi(lineNumber.c_str()) - 1;
              if (lineIdx >= 0) {
                while (vec.size() <= static_cast<size_t>(lineIdx)) {
                  vec.push_back(-1);
                }

                // Initially all entries are -1 (not used). If we get coverage
                // information, increment it to 0 first.
                if (vec[lineIdx] < 0) {
                  if (cov > 0 || prefix.find('#') != std::string::npos) {
                    vec[lineIdx] = 0;
                  }
                }

                vec[lineIdx] += cov;
              }
            }
          }

          actualSourceFile = "";
        }
      }
    }

    file_count++;

    if (file_count % 50 == 0) {
      cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                         " processed: " << file_count << " out of "
                                        << files.size() << std::endl,
                         this->Quiet);
      cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT, "    ", this->Quiet);
    }
  }

  return file_count;
}